

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
run_main_loop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
              *this)

{
  activity_stats_t *paVar1;
  rep rVar2;
  
  (this->m_activity_tracker).m_waiting.m_is_in_working = true;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_activity_tracker).m_waiting.m_work_started_at.__d.__r = rVar2;
  paVar1 = &(this->m_activity_tracker).m_waiting.m_work_activity;
  paVar1->m_count = paVar1->m_count + 1;
  while( true ) {
    process_final_deregs_if_any(this);
    perform_shutdown_related_actions_if_needed(this);
    if (this->m_shutdown_status == completed) break;
    (*((this->m_timer_manager)._M_t.
       super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>.
       _M_t.
       super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>.
       super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl)->_vptr_timer_manager_t[2]
    )();
    try_handle_next_demand(this);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::run_main_loop()
	{
		// Assume that waiting for new demands is started.
		// This call is necessary because if there is a demand
		// in event queue then m_activity_tracker.wait_stopped() will be
		// called without previous m_activity_tracker.wait_started().
		m_activity_tracker.wait_started();

		for(;;)
			{
				// The first step: all pending final deregs must be processed.
				process_final_deregs_if_any();

				// There can be pending shutdown operation. It must be handled.
				perform_shutdown_related_actions_if_needed();
				if( shutdown_status_t::completed == m_shutdown_status )
					break;

				// The next step: all timers must be converted to events.
				handle_expired_timers_if_any();

				// The last step: an attempt to process demand.
				// Or sleep for some time until next demand arrived.
				try_handle_next_demand();
			}
	}